

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::java::(anonymous_namespace)::FieldName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,FieldDescriptor *field)

{
  bool bVar1;
  Type TVar2;
  long lVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  TVar2 = FieldDescriptor::type((FieldDescriptor *)this);
  if (TVar2 == TYPE_GROUP) {
    FieldDescriptor::message_type((FieldDescriptor *)this);
  }
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  lVar3 = 0;
  do {
    if (lVar3 == 0xc) {
      return __return_storage_ptr__;
    }
    bVar1 = std::operator==(__return_storage_ptr__,
                            (char *)((long)&
                                           _ZN6google8protobuf8compiler4java12_GLOBAL__N_118kForbiddenWordListE_rel
                                    + (long)*(int *)((long)&
                                                  _ZN6google8protobuf8compiler4java12_GLOBAL__N_118kForbiddenWordListE_rel
                                                  + lVar3)));
    lVar3 = lVar3 + 4;
  } while (!bVar1);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string FieldName(const FieldDescriptor* field) {
  string field_name;
  // Groups are hacky:  The name of the field is just the lower-cased name
  // of the group type.  In Java, though, we would like to retain the original
  // capitalization of the type name.
  if (GetType(field) == FieldDescriptor::TYPE_GROUP) {
    field_name = field->message_type()->name();
  } else {
    field_name = field->name();
  }
  if (IsForbidden(field_name)) {
    // Append a trailing "#" to indicate that the name should be decorated to
    // avoid collision with other names.
    field_name += "#";
  }
  return field_name;
}